

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCVS.cxx
# Opt level: O2

bool __thiscall cmCTestCVS::UpdateImpl(cmCTestCVS *this)

{
  cmCTest *pcVar1;
  bool bVar2;
  int iVar3;
  string *arg;
  pointer pbVar4;
  vector<const_char_*,_std::allocator<const_char_*>_> cvs_update;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  string opts;
  UpdateParser out;
  UpdateParser err;
  
  pcVar1 = (this->super_cmCTestVC).CTest;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&out,"UpdateOptions",(allocator<char> *)&err);
  cmCTest::GetCTestConfiguration(&opts,pcVar1,(string *)&out);
  std::__cxx11::string::~string((string *)&out);
  if (opts._M_string_length == 0) {
    pcVar1 = (this->super_cmCTestVC).CTest;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&err,"CVSUpdateOptions",(allocator<char> *)&cvs_update);
    cmCTest::GetCTestConfiguration((string *)&out,pcVar1,(string *)&err);
    std::__cxx11::string::operator=((string *)&opts,(string *)&out);
    std::__cxx11::string::~string((string *)&out);
    std::__cxx11::string::~string((string *)&err);
    if (opts._M_string_length == 0) {
      std::__cxx11::string::assign((char *)&opts);
    }
  }
  cmSystemTools::ParseArguments(&args,&opts);
  iVar3 = cmCTest::GetTestModel((this->super_cmCTestVC).CTest);
  if (iVar3 == 1) {
    cmCTestVC::GetNightlyTime_abi_cxx11_((string *)&cvs_update,&this->super_cmCTestVC);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&err,"-D",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cvs_update)
    ;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&out,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&err," UTC")
    ;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&args,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&out);
    std::__cxx11::string::~string((string *)&out);
    std::__cxx11::string::~string((string *)&err);
    std::__cxx11::string::~string((string *)&cvs_update);
  }
  cvs_update.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cvs_update.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  cvs_update.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  out.super_LineParser.super_OutputParser._vptr_OutputParser =
       (_func_int **)(this->super_cmCTestVC).CommandLineTool._M_dataplus._M_p;
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&cvs_update,(char **)&out);
  out.super_LineParser.super_OutputParser._vptr_OutputParser = (_func_int **)anon_var_dwarf_1b8e9c9;
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&cvs_update,(char **)&out);
  out.super_LineParser.super_OutputParser._vptr_OutputParser = (_func_int **)0x69131c;
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&cvs_update,(char **)&out);
  for (pbVar4 = args.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pbVar4 != args.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; pbVar4 = pbVar4 + 1) {
    out.super_LineParser.super_OutputParser._vptr_OutputParser =
         (_func_int **)(pbVar4->_M_dataplus)._M_p;
    std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)&cvs_update,(char **)&out);
  }
  out.super_LineParser.super_OutputParser._vptr_OutputParser = (_func_int **)0x0;
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&cvs_update,(char **)&out);
  UpdateParser::UpdateParser(&out,this,"up-out> ");
  UpdateParser::UpdateParser(&err,this,"up-err> ");
  bVar2 = cmCTestVC::RunUpdateCommand
                    (&this->super_cmCTestVC,
                     cvs_update.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                     _M_impl.super__Vector_impl_data._M_start,(OutputParser *)&out,
                     (OutputParser *)&err,Auto);
  UpdateParser::~UpdateParser(&err);
  UpdateParser::~UpdateParser(&out);
  std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
            (&cvs_update.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&args);
  std::__cxx11::string::~string((string *)&opts);
  return bVar2;
}

Assistant:

bool cmCTestCVS::UpdateImpl()
{
  // Get user-specified update options.
  std::string opts = this->CTest->GetCTestConfiguration("UpdateOptions");
  if (opts.empty()) {
    opts = this->CTest->GetCTestConfiguration("CVSUpdateOptions");
    if (opts.empty()) {
      opts = "-dP";
    }
  }
  std::vector<std::string> args = cmSystemTools::ParseArguments(opts);

  // Specify the start time for nightly testing.
  if (this->CTest->GetTestModel() == cmCTest::NIGHTLY) {
    args.push_back("-D" + this->GetNightlyTime() + " UTC");
  }

  // Run "cvs update" to update the work tree.
  std::vector<char const*> cvs_update;
  cvs_update.push_back(this->CommandLineTool.c_str());
  cvs_update.push_back("-z3");
  cvs_update.push_back("update");
  for (std::string const& arg : args) {
    cvs_update.push_back(arg.c_str());
  }
  cvs_update.push_back(nullptr);

  UpdateParser out(this, "up-out> ");
  UpdateParser err(this, "up-err> ");
  return this->RunUpdateCommand(cvs_update.data(), &out, &err);
}